

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

bool __thiscall libchars::history::prev(history *this)

{
  bool bVar1;
  iterator local_38;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  iterator local_28;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  history *local_18;
  history *this_local;
  
  local_18 = this;
  if (((byte)this[8] & 1) == 0) {
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 0x30));
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this + 0x30));
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_20,&local_28);
      *(_List_node_base **)(this + 0x48) = local_20._M_node;
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 0x48));
      this[0x50] = (history)0x0;
      this[8] = (history)0x1;
      this_local._7_1_ = true;
    }
  }
  else {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this + 0x30));
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator==((_Self *)(this + 0x48),&local_30);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 0x48));
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool history::prev()
    {
        if (!busy) {
            if (lines.empty()) {
                return false;
            }
            else {
                // use last value in list
                li = lines.end();
                --li;
                overflow = false;
                busy = true;
                return true;
            }
        }
        else {
            if (li == lines.begin()) {
                // stay on current value
                return false;
            }
            else {
                // use previous value
                --li;
                return true;
            }
        }
    }